

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  rnndb *prVar2;
  size_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  fout *pfVar6;
  int in_EDI;
  int j_3;
  int j_2;
  int j_1;
  fout f;
  char *dstname;
  int j;
  int i;
  rnndb *db;
  undefined4 in_stack_00000074;
  undefined1 in_stack_00000080 [24];
  char *in_stack_ffffffffffffff88;
  rnnbitfield *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_20;
  int local_1c;
  
  if (in_EDI < 2) {
    fprintf(_stderr,"Usage:\n\theadergen database-file\n");
    exit(1);
  }
  rnn_init();
  prVar2 = rnn_newdb();
  rnn_parsefile((rnndb *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffa8);
  rnn_prepdb((rnndb *)in_stack_ffffffffffffff90);
  local_1c = 0;
  while( true ) {
    if (prVar2->filesnum <= local_1c) {
      for (local_1c = 0; local_1c < prVar2->enumsnum; local_1c = local_1c + 1) {
        if (prVar2->enums[local_1c]->isinline == 0) {
          for (local_44 = 0; local_44 < prVar2->enums[local_1c]->valsnum; local_44 = local_44 + 1) {
            printvalue((rnnvalue *)in_stack_ffffffffffffff90,
                       (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
          }
        }
      }
      for (local_1c = 0; local_1c < prVar2->bitsetsnum; local_1c = local_1c + 1) {
        if (prVar2->bitsets[local_1c]->isinline == 0) {
          for (local_48 = 0; local_48 < prVar2->bitsets[local_1c]->bitfieldsnum;
              local_48 = local_48 + 1) {
            printbitfield(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
            ;
          }
        }
      }
      for (local_1c = 0; local_1c < prVar2->domainsnum; local_1c = local_1c + 1) {
        if (prVar2->domains[local_1c]->size != 0) {
          printdef((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                   (uint64_t)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
        }
        for (in_stack_ffffffffffffffb4 = 0;
            in_stack_ffffffffffffffb4 < prVar2->domains[local_1c]->subelemsnum;
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
          printdelem((rnndelem *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (uint64_t)in_stack_ffffffffffffff98);
        }
      }
      for (local_1c = 0; local_1c < foutsnum; local_1c = local_1c + 1) {
        fprintf((FILE *)fouts[local_1c].file,"\n#endif /* %s */\n",fouts[local_1c].guard);
      }
      return prVar2->estatus;
    }
    sVar3 = strlen(prVar2->files[local_1c]);
    pcVar4 = (char *)malloc(sVar3 + 3);
    strcpy(pcVar4,prVar2->files[local_1c]);
    strcat(pcVar4,".h");
    in_stack_ffffffffffffff88 = prVar2->files[local_1c];
    in_stack_ffffffffffffff90 = (rnnbitfield *)fopen(pcVar4,"w");
    if (in_stack_ffffffffffffff90 == (rnnbitfield *)0x0) break;
    free(pcVar4);
    in_stack_ffffffffffffff98 = strdup(in_stack_ffffffffffffff88);
    local_20 = 0;
    while( true ) {
      in_stack_ffffffffffffffa8 = (char *)(long)local_20;
      pcVar4 = (char *)strlen(in_stack_ffffffffffffff98);
      if (pcVar4 <= in_stack_ffffffffffffffa8) break;
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[(int)in_stack_ffffffffffffff98[local_20]] & 8) == 0) {
        in_stack_ffffffffffffff98[local_20] = '_';
      }
      else {
        iVar1 = toupper((int)in_stack_ffffffffffffff98[local_20]);
        in_stack_ffffffffffffff98[local_20] = (char)iVar1;
      }
      local_20 = local_20 + 1;
    }
    if (foutsmax <= foutsnum) {
      if (foutsmax == 0) {
        foutsmax = 0x10;
      }
      else {
        foutsmax = foutsmax << 1;
      }
      fouts = (fout *)realloc(fouts,(long)foutsmax * 0x18);
    }
    pfVar6 = fouts + foutsnum;
    foutsnum = foutsnum + 1;
    pfVar6->name = in_stack_ffffffffffffff88;
    pfVar6->file = (FILE *)in_stack_ffffffffffffff90;
    pfVar6->guard = in_stack_ffffffffffffff98;
    printhead((fout)in_stack_00000080,(rnndb *)CONCAT44(in_stack_00000074,argc));
    local_1c = local_1c + 1;
  }
  perror(pcVar4);
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		f.guard = strdup(f.name);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	return db->estatus;
}